

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scsp.c
# Opt level: O1

void device_reset_scsp(void *info)

{
  undefined1 *puVar1;
  long lVar2;
  
  puVar1 = (undefined1 *)((long)info + 0x59);
  lVar2 = 0;
  do {
    *(int *)(puVar1 + 0x6f) = (int)lVar2;
    *puVar1 = 0;
    *(undefined8 *)(puVar1 + 7) = 0;
    *(undefined4 *)(puVar1 + 0x1f) = 3;
    lVar2 = lVar2 + 1;
    puVar1 = puVar1 + 0x98;
  } while (lVar2 != 0x20);
  SCSPDSP_Init((SCSPDSP *)((long)info + 0x82688));
  *(uint *)((long)info + 0x82690) = *(uint *)((long)info + 0x1448) >> 1;
  *(undefined8 *)((long)info + 0x82688) = *(undefined8 *)((long)info + 0x1440);
  return;
}

Assistant:

static void device_reset_scsp(void* info)
{
	scsp_state *scsp = (scsp_state *)info;
	int i;
	
	// make sure all the slots are off
	for(i=0;i<32;++i)
	{
		scsp->Slots[i].slot=i;
		scsp->Slots[i].active=0;
		scsp->Slots[i].base=NULL;
		scsp->Slots[i].EG.state=SCSP_RELEASE;
	}
	
	SCSPDSP_Init(&scsp->DSP);
	scsp->DSP.SCSPRAM_LENGTH = scsp->SCSPRAM_LENGTH / 2;
	scsp->DSP.SCSPRAM = (UINT16*)scsp->SCSPRAM;
	
	return;
}